

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O1

void copy_values_to_match_command(Am_Object *match_command,Am_Value *items_value)

{
  Am_Am_Slot_Key key;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value_00;
  Am_Object start_object;
  Am_Object main_cmd;
  Am_Object script_group;
  Am_Object script_part;
  Am_Value_List slots_to_save;
  Am_Value value;
  Am_Value_List parts;
  Am_Value_List items;
  Am_Am_Slot_Key local_9a;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object *local_78;
  Am_Value_List local_70;
  Am_Value local_60;
  Am_Value_List local_50;
  Am_Value_List local_40;
  
  local_78 = match_command;
  Am_Value_List::Am_Value_List(&local_40,items_value);
  pAVar2 = Am_Value_List::Get_First(&local_40);
  Am_Object::Am_Object(&local_88,pAVar2);
  pAVar2 = Am_Object::Get(&local_88,0xc5,0);
  Am_Object::Am_Object(&local_90,pAVar2);
  pAVar2 = Am_Object::Get(&local_90,0x11a,1);
  Am_Object::Am_Object(&local_98,pAVar2);
  pAVar2 = Am_Object::Get(&local_88,0x82,0);
  Am_Value_List::Am_Value_List(&local_50,pAVar2);
  local_80.data = (Am_Object_Data *)0x0;
  local_60.type = 0;
  local_60.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Am_Value_List(&local_70);
  Am_Value_List::Start(&local_50);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_50);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_50);
    Am_Object::operator=(&local_80,pAVar2);
    pAVar2 = Am_Object::Get(&local_80,0xb8,3);
    Am_Am_Slot_Key::Am_Am_Slot_Key(&local_9a,pAVar2);
    key.value = local_9a.value;
    if (local_9a.value != 0) {
      Am_Value_List::Add(&local_70,(uint)local_9a.value,Am_TAIL,true);
      pAVar2 = Am_Object::Get(&local_90,key.value,1);
      Am_Value::operator=(&local_60,pAVar2);
      bVar1 = Am_Value::Valid(&local_60);
      if (!bVar1) {
        bVar1 = Am_Object::Valid(&local_98);
        if (bVar1) {
          pAVar2 = Am_Object::Get(&local_98,key.value,1);
          Am_Value::operator=(&local_60,pAVar2);
        }
      }
      bVar1 = Am_Value::Valid(&local_60);
      if (bVar1) {
        Am_Object::Set(local_78,key.value,&local_60,1);
      }
    }
    Am_Value_List::Next(&local_50);
  }
  value_00 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_70);
  Am_Object::Set(local_78,0xb8,value_00,0);
  Am_Value_List::~Am_Value_List(&local_70);
  Am_Value::~Am_Value(&local_60);
  Am_Object::~Am_Object(&local_80);
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_88);
  Am_Value_List::~Am_Value_List(&local_40);
  return;
}

Assistant:

void
copy_values_to_match_command(Am_Object &match_command,
                             const Am_Value &items_value)
{
  Am_Value_List items = items_value;
  Am_Object script_group = items.Get_First();
  Am_Object main_cmd = script_group.Get(Am_COMMAND);
  //only used in create cmds
  Am_Object start_object = main_cmd.Peek(Am_START_OBJECT);
  Am_Value_List parts = script_group.Get(Am_GRAPHICAL_PARTS);
  Am_Am_Slot_Key slot;
  Am_Object script_part;
  Am_Value value;
  Am_Value_List slots_to_save;
  for (parts.Start(); !parts.Last(); parts.Next()) {
    script_part = parts.Get();
    slot = Am_Am_Slot_Key(
        script_part.Get(Am_SLOTS_TO_SAVE, Am_RETURN_ZERO_ON_ERROR));
    if ((int)slot != 0) {
      slots_to_save.Add(static_cast<int>(slot));
      value = main_cmd.Peek(slot);
      if (!value.Valid()) {
        if (start_object.Valid())
          value = start_object.Peek(slot);
      }
      if (value.Valid())
        match_command.Set(slot, value, Am_OK_IF_NOT_THERE);
    }
  }
  match_command.Set(Am_SLOTS_TO_SAVE, slots_to_save);
}